

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O1

void av1_calc_proj_params_high_bd_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 in_XMM1 [16];
  long lVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  undefined1 in_XMM3 [16];
  long lVar17;
  int iVar18;
  int iVar23;
  int iVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar26;
  undefined1 auVar27 [16];
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (params->r[0] < 1) {
LAB_0042d879:
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar14 = (undefined1  [16])0x0;
      lVar8 = 0;
      lVar13 = 0;
    }
    else {
      lVar16 = (long)src8 * 2;
      lVar17 = (long)dat8 * 2;
      lVar8 = 0;
      lVar13 = 0;
      uVar3 = 0;
      auVar14 = (undefined1  [16])0x0;
      do {
        if (0 < width) {
          lVar26 = 0;
          do {
            auVar20 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar17 + lVar26 * 2));
            auVar19 = pmovzxwd(in_XMM1,*(undefined8 *)(lVar16 + lVar26 * 2));
            piVar1 = flt1 + lVar26;
            auVar22._0_4_ = *piVar1 + auVar20._0_4_ * -0x10;
            auVar22._4_4_ = piVar1[1] + auVar20._4_4_ * -0x10;
            auVar22._8_4_ = piVar1[2] + auVar20._8_4_ * -0x10;
            auVar22._12_4_ = piVar1[3] + auVar20._12_4_ * -0x10;
            auVar11._0_4_ = (auVar19._0_4_ - auVar20._0_4_) * 0x10;
            auVar11._4_4_ = (auVar19._4_4_ - auVar20._4_4_) * 0x10;
            auVar11._8_4_ = (auVar19._8_4_ - auVar20._8_4_) * 0x10;
            auVar11._12_4_ = (auVar19._12_4_ - auVar20._12_4_) * 0x10;
            auVar19 = pmuldq(auVar22,auVar22);
            in_XMM3._0_8_ = auVar19._0_8_ + lVar8;
            in_XMM3._8_8_ = auVar19._8_8_ + lVar13;
            auVar20._4_4_ = auVar22._4_4_;
            auVar20._0_4_ = auVar22._4_4_;
            auVar20._8_4_ = auVar22._12_4_;
            auVar20._12_4_ = auVar22._12_4_;
            auVar27 = pmuldq(auVar22,auVar11);
            auVar12._4_4_ = 0;
            auVar12._0_4_ = auVar11._4_4_;
            auVar12._8_8_ = auVar11._8_8_ >> 0x20;
            auVar30 = pmuldq(auVar12,auVar20);
            auVar19 = pmuldq(auVar20,auVar20);
            lVar8 = auVar19._0_8_ + in_XMM3._0_8_;
            lVar13 = auVar19._8_8_ + in_XMM3._8_8_;
            in_XMM1._0_8_ = auVar30._0_8_ + auVar27._0_8_ + auVar14._0_8_;
            in_XMM1._8_8_ = auVar30._8_8_ + auVar27._8_8_ + auVar14._8_8_;
            lVar26 = lVar26 + 4;
            auVar14 = in_XMM1;
          } while (lVar26 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        lVar16 = lVar16 + (long)src_stride * 2;
        lVar17 = lVar17 + (long)dat_stride * 2;
        in_XMM1 = auVar14;
      } while (uVar3 != (uint)height);
    }
    *C = 0;
    C[1] = auVar14._8_8_ + auVar14._0_8_;
    H[1][0] = 0;
    H[1][1] = lVar13 + lVar8;
    lVar13 = (long)(height * width);
    H[1][1] = H[1][1] / lVar13;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < params->r[0]) {
        if (height < 1) {
          auVar14 = (undefined1  [16])0x0;
          lVar8 = 0;
          lVar13 = 0;
        }
        else {
          lVar16 = (long)src8 * 2;
          lVar17 = (long)dat8 * 2;
          lVar8 = 0;
          lVar13 = 0;
          uVar3 = 0;
          auVar14 = (undefined1  [16])0x0;
          do {
            if (0 < width) {
              lVar26 = 0;
              do {
                auVar20 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar17 + lVar26 * 2));
                auVar19 = pmovzxwd(in_XMM1,*(undefined8 *)(lVar16 + lVar26 * 2));
                piVar1 = flt0 + lVar26;
                auVar21._0_4_ = *piVar1 + auVar20._0_4_ * -0x10;
                auVar21._4_4_ = piVar1[1] + auVar20._4_4_ * -0x10;
                auVar21._8_4_ = piVar1[2] + auVar20._8_4_ * -0x10;
                auVar21._12_4_ = piVar1[3] + auVar20._12_4_ * -0x10;
                auVar9._0_4_ = (auVar19._0_4_ - auVar20._0_4_) * 0x10;
                auVar9._4_4_ = (auVar19._4_4_ - auVar20._4_4_) * 0x10;
                auVar9._8_4_ = (auVar19._8_4_ - auVar20._8_4_) * 0x10;
                auVar9._12_4_ = (auVar19._12_4_ - auVar20._12_4_) * 0x10;
                auVar19 = pmuldq(auVar21,auVar21);
                in_XMM3._0_8_ = auVar19._0_8_ + lVar8;
                in_XMM3._8_8_ = auVar19._8_8_ + lVar13;
                auVar7._4_4_ = auVar21._4_4_;
                auVar7._0_4_ = auVar21._4_4_;
                auVar7._8_4_ = auVar21._12_4_;
                auVar7._12_4_ = auVar21._12_4_;
                auVar30 = pmuldq(auVar21,auVar9);
                auVar10._4_4_ = 0;
                auVar10._0_4_ = auVar9._4_4_;
                auVar10._8_8_ = auVar9._8_8_ >> 0x20;
                auVar20 = pmuldq(auVar10,auVar7);
                auVar19 = pmuldq(auVar7,auVar7);
                lVar8 = auVar19._0_8_ + in_XMM3._0_8_;
                lVar13 = auVar19._8_8_ + in_XMM3._8_8_;
                in_XMM1._0_8_ = auVar20._0_8_ + auVar30._0_8_ + auVar14._0_8_;
                in_XMM1._8_8_ = auVar20._8_8_ + auVar30._8_8_ + auVar14._8_8_;
                lVar26 = lVar26 + 4;
                auVar14 = in_XMM1;
              } while (lVar26 < width);
            }
            uVar3 = uVar3 + 1;
            flt0 = flt0 + flt0_stride;
            lVar16 = lVar16 + (long)src_stride * 2;
            lVar17 = lVar17 + (long)dat_stride * 2;
            in_XMM1 = auVar14;
          } while (uVar3 != (uint)height);
        }
        *C = auVar14._8_8_ + auVar14._0_8_;
        C[1] = 0;
        (*H)[0] = lVar13 + lVar8;
        (*H)[1] = 0;
        lVar13 = (long)(height * width);
        (*H)[0] = (*H)[0] / lVar13;
        goto LAB_0042d989;
      }
      goto LAB_0042d879;
    }
    lVar26 = 0;
    lVar28 = 0;
    auVar19 = (undefined1  [16])0x0;
    auVar14 = (undefined1  [16])0x0;
    lVar16 = 0;
    lVar17 = 0;
    lVar8 = 0;
    lVar13 = 0;
    if (0 < height) {
      lVar4 = (long)src8 * 2;
      lVar5 = (long)dat8 * 2;
      uVar3 = 0;
      auVar19 = (undefined1  [16])0x0;
      lVar26 = 0;
      lVar28 = 0;
      do {
        if (0 < width) {
          lVar6 = 0;
          do {
            auVar20 = pmovzxwd(auVar19,*(undefined8 *)(lVar5 + lVar6 * 2));
            auVar30 = pmovzxwd(in_XMM9,*(undefined8 *)(lVar4 + lVar6 * 2));
            piVar1 = flt0 + lVar6;
            piVar2 = flt1 + lVar6;
            iVar18 = auVar20._0_4_;
            iVar23 = auVar20._4_4_;
            iVar24 = auVar20._8_4_;
            iVar25 = auVar20._12_4_;
            in_XMM9._0_4_ = (auVar30._0_4_ - iVar18) * 0x10;
            in_XMM9._4_4_ = (auVar30._4_4_ - iVar23) * 0x10;
            in_XMM9._8_4_ = (auVar30._8_4_ - iVar24) * 0x10;
            in_XMM9._12_4_ = (auVar30._12_4_ - iVar25) * 0x10;
            auVar31._0_4_ = *piVar1 + iVar18 * -0x10;
            auVar31._4_4_ = piVar1[1] + iVar23 * -0x10;
            auVar31._8_4_ = piVar1[2] + iVar24 * -0x10;
            auVar31._12_4_ = piVar1[3] + iVar25 * -0x10;
            auVar29._0_4_ = *piVar2 + iVar18 * -0x10;
            auVar29._4_4_ = piVar2[1] + iVar23 * -0x10;
            auVar29._8_4_ = piVar2[2] + iVar24 * -0x10;
            auVar29._12_4_ = piVar2[3] + iVar25 * -0x10;
            auVar27 = pmuldq(auVar31,auVar31);
            auVar30._4_4_ = auVar31._4_4_;
            auVar30._0_4_ = auVar31._4_4_;
            auVar30._8_4_ = auVar31._12_4_;
            auVar30._12_4_ = auVar31._12_4_;
            auVar20 = pmuldq(auVar30,auVar30);
            lVar8 = auVar20._0_8_ + auVar27._0_8_ + lVar8;
            lVar13 = auVar20._8_8_ + auVar27._8_8_ + lVar13;
            auVar32 = pmuldq(auVar29,auVar31);
            auVar27._4_4_ = auVar29._4_4_;
            auVar27._0_4_ = auVar29._4_4_;
            auVar27._8_4_ = auVar29._12_4_;
            auVar27._12_4_ = auVar29._12_4_;
            auVar20 = pmuldq(auVar27,auVar30);
            lVar16 = auVar20._0_8_ + auVar32._0_8_ + lVar16;
            lVar17 = auVar20._8_8_ + auVar32._8_8_ + lVar17;
            auVar32 = pmuldq(auVar29,auVar29);
            lVar15 = auVar14._8_8_;
            auVar20 = pmuldq(auVar27,auVar27);
            auVar14._0_8_ = auVar20._0_8_ + auVar32._0_8_ + auVar14._0_8_;
            auVar14._8_8_ = auVar20._8_8_ + auVar32._8_8_ + lVar15;
            auVar31 = pmuldq(auVar31,in_XMM9);
            lVar15 = auVar19._8_8_;
            auVar32._4_4_ = in_XMM9._4_4_;
            auVar32._0_4_ = in_XMM9._4_4_;
            auVar32._8_4_ = in_XMM9._12_4_;
            auVar32._12_4_ = in_XMM9._12_4_;
            auVar20 = pmuldq(auVar30,auVar32);
            auVar19._0_8_ = auVar20._0_8_ + auVar31._0_8_ + auVar19._0_8_;
            auVar19._8_8_ = auVar20._8_8_ + auVar31._8_8_ + lVar15;
            auVar30 = pmuldq(auVar29,in_XMM9);
            auVar20 = pmuldq(auVar27,auVar32);
            lVar26 = auVar20._0_8_ + auVar30._0_8_ + lVar26;
            lVar28 = auVar20._8_8_ + auVar30._8_8_ + lVar28;
            lVar6 = lVar6 + 4;
          } while (lVar6 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar4 = lVar4 + (long)src_stride * 2;
        lVar5 = lVar5 + (long)dat_stride * 2;
      } while (uVar3 != (uint)height);
    }
    auVar20 = pblendw((undefined1  [16])0x0,auVar14,0xf0);
    *C = auVar19._8_8_ + auVar19._0_8_;
    C[1] = lVar28 + lVar26;
    (*H)[0] = lVar13 + lVar8;
    (*H)[1] = lVar17 + lVar16;
    H[1][0] = auVar20._0_8_;
    H[1][1] = auVar14._0_8_ + auVar20._8_8_;
    lVar13 = (long)(height * width);
    lVar8 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar13;
    lVar8 = lVar8 / lVar13;
    (*H)[1] = lVar8;
    H[1][1] = H[1][1] / lVar13;
    H[1][0] = lVar8;
    *C = *C / lVar13;
  }
  C = C + 1;
LAB_0042d989:
  *C = *C / lVar13;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_sse4_1(const uint8_t *src8, int width,
                                         int height, int src_stride,
                                         const uint8_t *dat8, int dat_stride,
                                         int32_t *flt0, int flt0_stride,
                                         int32_t *flt1, int flt1_stride,
                                         int64_t H[2][2], int64_t C[2],
                                         const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                          dat_stride, flt0, flt0_stride, flt1,
                                          flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt1, flt1_stride, H, C);
  }
}